

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

mpc_ast_trav_t * mpc_ast_traverse_start(mpc_ast_t *ast,mpc_ast_trav_order_t order)

{
  mpc_ast_trav_t *pmVar1;
  mpc_ast_trav_order_t in_ESI;
  mpc_ast_t *in_RDI;
  mpc_ast_t *cnode;
  mpc_ast_trav_t *n_trav;
  mpc_ast_trav_t *trav;
  mpc_ast_t *local_28;
  mpc_ast_trav_t *local_18;
  
  local_18 = (mpc_ast_trav_t *)malloc(0x18);
  local_18->curr_node = in_RDI;
  local_18->parent = (mpc_ast_trav_t *)0x0;
  local_18->curr_child = 0;
  local_18->order = in_ESI;
  if ((in_ESI != mpc_ast_trav_order_pre) && (local_28 = in_RDI, in_ESI == mpc_ast_trav_order_post))
  {
    while (0 < local_28->children_num) {
      local_28 = *local_28->children;
      pmVar1 = (mpc_ast_trav_t *)malloc(0x18);
      pmVar1->curr_node = local_28;
      pmVar1->parent = local_18;
      pmVar1->curr_child = 0;
      pmVar1->order = mpc_ast_trav_order_post;
      local_18 = pmVar1;
    }
  }
  return local_18;
}

Assistant:

mpc_ast_trav_t *mpc_ast_traverse_start(mpc_ast_t *ast,
                                       mpc_ast_trav_order_t order)
{
  mpc_ast_trav_t *trav, *n_trav;
  mpc_ast_t *cnode = ast;

  /* Create the traversal structure */
  trav = malloc(sizeof(mpc_ast_trav_t));
  trav->curr_node = cnode;
  trav->parent = NULL;
  trav->curr_child = 0;
  trav->order = order;

  /* Get start node */
  switch(order) {
    case mpc_ast_trav_order_pre:
      /* Nothing else is needed for pre order start */
      break;

    case mpc_ast_trav_order_post:
      while(cnode->children_num > 0) {
        cnode = cnode->children[0];

        n_trav = malloc(sizeof(mpc_ast_trav_t));
        n_trav->curr_node = cnode;
        n_trav->parent = trav;
        n_trav->curr_child = 0;
        n_trav->order = order;

        trav = n_trav;
      }

      break;

    default:
      /* Unreachable, but compiler complaints */
      break;
  }

  return trav;
}